

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
hta::detail::make_exception<const_char_*>::operator()
          (make_exception<const_char_*> *this,stringstream *msg,char *arg)

{
  char *arg_local;
  stringstream *msg_local;
  make_exception<const_char_*> *this_local;
  
  std::operator<<((ostream *)(msg + 0x10),arg);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg)
        {
            msg << arg;
        }